

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O1

vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
* get_tensor_configs(vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                     *__return_storage_ptr__,mt19937 *rng)

{
  iterator __position;
  result_type rVar1;
  long lVar2;
  result_type rVar3;
  ulong uVar4;
  int i;
  int iVar5;
  ggml_type gVar6;
  array<long,_4UL> shape;
  long alStack_70 [3];
  pair<ggml_type,_std::array<long,_4UL>_> local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  ::reserve(__return_storage_ptr__,100);
  iVar5 = 0;
  do {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rng);
    gVar6 = (int)rVar1 + (int)(rVar1 / 0x27) * -0x27;
    lVar2 = ggml_type_size(gVar6);
    if (lVar2 != 0) {
      alStack_70[1] = 1;
      alStack_70[2] = 1;
      alStack_70[0] = 1;
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      lVar2 = ggml_blck_size(gVar6);
      lVar2 = lVar2 * ((rVar1 / 5 & 0xfffffffffffffffe) * -5 + rVar1 + 1);
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      if ((rVar1 & 3) != 0) {
        uVar4 = 0;
        do {
          rVar3 = std::
                  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  ::operator()(rng);
          alStack_70[uVar4] = (rVar3 / 5 & 0xfffffffffffffffe) * -5 + rVar3 + 1;
          uVar4 = uVar4 + 1;
        } while (((uint)rVar1 & 3) != uVar4);
      }
      local_58.second._M_elems[2] = alStack_70[1];
      local_58.second._M_elems[3] = alStack_70[2];
      local_58.second._M_elems[1] = alStack_70[0];
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_58.first = gVar6;
      local_58.second._M_elems[0] = lVar2;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<ggml_type,std::array<long,4ul>>,std::allocator<std::pair<ggml_type,std::array<long,4ul>>>>
        ::_M_realloc_insert<std::pair<ggml_type,std::array<long,4ul>>>
                  ((vector<std::pair<ggml_type,std::array<long,4ul>>,std::allocator<std::pair<ggml_type,std::array<long,4ul>>>>
                    *)__return_storage_ptr__,__position,&local_58);
      }
      else {
        ((__position._M_current)->second)._M_elems[3] = alStack_70[2];
        ((__position._M_current)->second)._M_elems[1] = alStack_70[0];
        ((__position._M_current)->second)._M_elems[2] = alStack_70[1];
        *(ulong *)__position._M_current = CONCAT44(local_58._4_4_,gVar6);
        ((__position._M_current)->second)._M_elems[0] = lVar2;
        (__return_storage_ptr__->
        super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 100);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<tensor_config_t> get_tensor_configs(std::mt19937 & rng) {
    std::vector<tensor_config_t> tensor_configs;
    tensor_configs.reserve(100);

    for (int i = 0; i < 100; ++i) {
        const enum ggml_type type = ggml_type(rng() % GGML_TYPE_COUNT);
        if (ggml_type_size(type) == 0) {
            continue;
        }

        std::array<int64_t, GGML_MAX_DIMS> shape = {1, 1, 1, 1};
        shape[0] = (1 + rng() % 10) * ggml_blck_size(type);
        const int n_dims = 1 + rng() % GGML_MAX_DIMS;
        for (int i = 1; i < n_dims; ++i) {
            shape[i] = 1 + rng() % 10;
        }

        tensor_configs.push_back(std::make_pair(type, shape));
    }

    return tensor_configs;
}